

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O0

MATRIX mat_fill(MATRIX A,int type)

{
  int j;
  int i;
  int type_local;
  MATRIX A_local;
  
  if ((type != -1) && ((uint)type < 2)) {
    for (i = 0; i < *(int *)(A + -1); i = i + 1) {
      for (j = 0; j < *(int *)((long)A + -4); j = j + 1) {
        if ((type == 1) && (i == j)) {
          A[i][j] = 1.0;
        }
        else {
          A[i][j] = 0.0;
        }
      }
    }
  }
  return A;
}

Assistant:

MATRIX mat_fill( MATRIX A, int type )
{
	int	i, j;

	switch (type)
		{
		case UNDEFINED:
			break;
		case ZERO_MATRIX:
		case UNIT_MATRIX:
			for (i=0; i<MatRow(A); i++)
			for (j=0; j<MatCol(A); j++)
				{
				if (type == UNIT_MATRIX)
					{
					if (i==j)
						{
						A[i][j] = 1.0;
						continue;
						}
					}
				A[i][j] = 0.0;
				}
			break;
		}
	return (A);
}